

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack19_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7ffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x13;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x3f) << 0xd | *puVar1;
  out[2] = *puVar2 >> 6 & 0x7ffff;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x19;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xfff) << 7 | *puVar1;
  out[4] = *puVar2 >> 0xc & 0x7ffff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[3] & 0x3ffff) << 1 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[3] >> 0x12;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0x1f) << 0xe | *puVar1;
  out[7] = *puVar2 >> 5 & 0x7ffff;
  puVar1 = out + 8;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 0x7ff) << 8 | *puVar1;
  out[9] = *puVar2 >> 0xb & 0x7ffff;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[6] & 0x1ffff) << 2 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[6] >> 0x11;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 0xf) << 0xf | *puVar1;
  out[0xc] = *puVar2 >> 4 & 0x7ffff;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x17;
  puVar2 = in + 8;
  *puVar1 = (*puVar2 & 0x3ff) << 9 | *puVar1;
  out[0xe] = *puVar2 >> 10 & 0x7ffff;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[9] & 0xffff) << 3 | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[9] >> 0x10;
  puVar2 = in + 10;
  *puVar1 = (*puVar2 & 7) << 0x10 | *puVar1;
  out[0x11] = *puVar2 >> 3 & 0x7ffff;
  puVar1 = out + 0x12;
  *puVar1 = *puVar2 >> 0x16;
  puVar2 = in + 0xb;
  *puVar1 = (*puVar2 & 0x1ff) << 10 | *puVar1;
  out[0x13] = *puVar2 >> 9 & 0x7ffff;
  puVar1 = out + 0x14;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[0xc] & 0x7fff) << 4 | *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0xc] >> 0xf;
  puVar2 = in + 0xd;
  *puVar1 = (*puVar2 & 3) << 0x11 | *puVar1;
  out[0x16] = *puVar2 >> 2 & 0x7ffff;
  puVar1 = out + 0x17;
  *puVar1 = *puVar2 >> 0x15;
  puVar2 = in + 0xe;
  *puVar1 = (*puVar2 & 0xff) << 0xb | *puVar1;
  out[0x18] = *puVar2 >> 8 & 0x7ffff;
  puVar1 = out + 0x19;
  *puVar1 = *puVar2 >> 0x1b;
  *puVar1 = (in[0xf] & 0x3fff) << 5 | *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = in[0xf] >> 0xe;
  puVar2 = in + 0x10;
  *puVar1 = (*puVar2 & 1) << 0x12 | *puVar1;
  out[0x1b] = *puVar2 >> 1 & 0x7ffff;
  puVar1 = out + 0x1c;
  *puVar1 = *puVar2 >> 0x14;
  puVar2 = in + 0x11;
  *puVar1 = (*puVar2 & 0x7f) << 0xc | *puVar1;
  out[0x1d] = *puVar2 >> 7 & 0x7ffff;
  puVar1 = out + 0x1e;
  *puVar1 = *puVar2 >> 0x1a;
  *puVar1 = (in[0x12] & 0x1fff) << 6 | *puVar1;
  out[0x1f] = in[0x12] >> 0xd;
  return in + 0x13;
}

Assistant:

const uint32_t *__fastunpack19_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 11)) << (19 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 19);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 17)) << (19 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 4)) << (19 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 19);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 10)) << (19 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 19);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 16)) << (19 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 3)) << (19 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 19);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 9)) << (19 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 19);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 15)) << (19 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 2)) << (19 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 19);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 8)) << (19 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 19);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 14)) << (19 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 1)) << (19 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 19);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 7)) << (19 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 19);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 13)) << (19 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  out++;

  return in;
}